

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::doAddClique
          (HighsCliqueTable *this,CliqueVar *cliquevars,HighsInt numcliquevars,bool equality,
          HighsInt origin)

{
  _Rb_tree_header *p_Var1;
  pointer *ppCVar2;
  pointer *ppCVar3;
  int *piVar4;
  pointer pCVar5;
  _Rb_tree_color _Var6;
  HighsInt HVar7;
  CliqueVar CVar8;
  pointer piVar9;
  iterator __position;
  Substitution SVar10;
  iterator iVar11;
  iterator __position_00;
  pointer pCVar12;
  bool bVar13;
  pointer pCVar14;
  ValueType *pVVar15;
  ValueType *pVVar16;
  uint uVar17;
  _Base_ptr p_Var18;
  int iVar19;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar20;
  ulong uVar21;
  const_iterator cVar22;
  const_iterator __position_01;
  ulong uVar23;
  int iVar24;
  long lVar25;
  CliqueVar CVar26;
  uint uVar27;
  pair<const_int_*,_bool> pVar28;
  pair<int_*,_bool> pVar29;
  HighsInt cliqueid;
  CliqueVar v;
  HighsInt k;
  CliqueVar local_70;
  CliqueVar local_6c;
  CliqueVar local_68;
  CliqueVar local_64;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> local_60;
  int local_58;
  uint local_54;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_50;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_48;
  CliqueVar *local_40;
  ulong local_38;
  
  piVar9 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_54 = numcliquevars;
  if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar9) {
    __position._M_current =
         (this->cliques).
         super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    CVar26 = (CliqueVar)
             ((int)((ulong)((long)__position._M_current -
                           (long)(this->cliques).
                                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333);
    local_70 = CVar26;
    if (__position._M_current ==
        (this->cliques).
        super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
      _M_realloc_insert<>(&this->cliques,__position);
    }
    else {
      (__position._M_current)->start = 0;
      (__position._M_current)->end = 0;
      (__position._M_current)->origin = 0;
      (__position._M_current)->numZeroFixed = 0;
      *(undefined4 *)&(__position._M_current)->equality = 0;
      ppCVar2 = &(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar2 = *ppCVar2 + 1;
    }
  }
  else {
    CVar26 = *(CliqueVar *)(piVar9 + -1);
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar9 + -1;
    local_70 = CVar26;
  }
  uVar27 = local_54;
  pCVar14 = (this->cliques).
            super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar14[(int)CVar26].equality = equality;
  pCVar14[(int)CVar26].origin = origin;
  local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freespaces;
  if (((this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (p_Var18 = (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var18 == (_Base_ptr)0x0)) {
LAB_0025cc82:
    pCVar14[(int)local_70].start =
         (HighsInt)
         ((ulong)((long)(this->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cliqueentries).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
    pCVar14[(int)local_70].end = pCVar14[(int)local_70].start + local_54;
    lVar25 = (long)(int)local_70;
    local_58 = pCVar14[lVar25].end;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
              (&this->cliqueentries,(long)local_58);
    pCVar14 = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    p_Var1 = &(this->freespaces)._M_t._M_impl.super__Rb_tree_header;
    cVar22._M_node = &p_Var1->_M_header;
    do {
      if (((int)p_Var18[1]._M_color < (int)local_54) ||
         ((lVar25 = 0x10, __position_01._M_node = p_Var18, (int)p_Var18[1]._M_color <= (int)local_54
          && (*(int *)&p_Var18[1].field_0x4 < -1)))) {
        lVar25 = 0x18;
        __position_01._M_node = cVar22._M_node;
      }
      p_Var18 = *(_Base_ptr *)((long)&p_Var18->_M_color + lVar25);
      cVar22._M_node = __position_01._M_node;
    } while (p_Var18 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)__position_01._M_node == p_Var1) goto LAB_0025cc82;
    _Var6 = __position_01._M_node[1]._M_color;
    HVar7 = *(HighsInt *)&__position_01._M_node[1].field_0x4;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::erase_abi_cxx11_(local_48,__position_01);
    pCVar14 = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar14[(int)local_70].start = HVar7;
    pCVar14[(int)local_70].end = pCVar14[(int)local_70].start + uVar27;
    lVar25 = (long)(int)local_70;
    local_58 = _Var6 + pCVar14[lVar25].start;
  }
  pCVar14[lVar25].numZeroFixed = 0;
  local_6c = (CliqueVar)pCVar14[(int)local_70].start;
  local_64 = local_6c;
  if (uVar27 != 0) {
    local_50 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
               &this->infeasvertexstack;
    local_38 = (ulong)uVar27;
    uVar21 = 0;
    bVar13 = false;
    local_40 = cliquevars;
    do {
      local_68 = cliquevars[uVar21];
      piVar9 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar24 = piVar9[(uint)local_68 & 0x7fffffff];
      if (iVar24 != 0) {
        do {
          SVar10 = (this->substitutions).
                   super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)iVar24 + -1];
          local_68 = (CliqueVar)((uint)local_68 & 0x80000000 ^ 0x80000000 ^ (uint)SVar10.replace);
          iVar24 = *(int *)((long)piVar9 + ((ulong)SVar10 >> 0x1e & 0x1fffffffc));
        } while (iVar24 != 0);
      }
      if (bVar13) {
        iVar11._M_current =
             (this->infeasvertexstack).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->infeasvertexstack).
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>(local_50,iVar11,&local_68);
        }
        else {
          *iVar11._M_current = local_68;
          ppCVar3 = &(this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar3 = *ppCVar3 + 1;
        }
        bVar13 = true;
      }
      else {
        uVar17 = (int)local_68 << 1 | (uint)((int)((int)local_68 + 0x80000000U) < 0);
        uVar23 = (ulong)(uint)local_70 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                 (ulong)(uint)local_70 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32;
        if (uVar27 == 2) {
          pVVar15 = HighsHashTree<int,_void>::find_recurse
                              ((NodePtr)(this->invertedHashListSizeTwo).
                                        super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar17].root.
                                        ptrAndType,uVar23,0,(int *)&local_70);
          if (pVVar15 != (ValueType *)0x0) {
LAB_0025ce99:
            CVar26 = (CliqueVar)
                     (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_70].start;
            if (CVar26 != local_6c) {
              lVar25 = (long)(int)CVar26 << 2;
              do {
                pCVar12 = (this->cliqueentries).
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                CVar8 = *(CliqueVar *)(&pCVar12->field_0x0 + lVar25);
                if ((((uint)local_68 ^ (uint)CVar8) & 0x7fffffff) != 0) {
                  iVar11._M_current =
                       (this->infeasvertexstack).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar11._M_current ==
                      (this->infeasvertexstack).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                              (local_50,iVar11,(CliqueVar *)(&pCVar12->field_0x0 + lVar25));
                  }
                  else {
                    *iVar11._M_current = CVar8;
                    ppCVar3 = &(this->infeasvertexstack).
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppCVar3 = *ppCVar3 + 1;
                  }
                }
                unlink(this,(char *)(ulong)(uint)CVar26);
                CVar26 = (CliqueVar)((int)CVar26 + 1);
                lVar25 = lVar25 + 4;
              } while (local_6c != CVar26);
              local_6c = (CliqueVar)
                         (this->cliques).
                         super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ._M_impl.super__Vector_impl_data._M_start[(int)local_70].start;
              uVar27 = local_54;
            }
            bVar13 = true;
            cliquevars = local_40;
            local_64 = local_6c;
            goto LAB_0025d029;
          }
          local_60.first = local_70;
          pVar28 = HighsHashTree<int,_void>::insert_recurse
                             (&(this->invertedHashListSizeTwo).
                               super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(int)((int)local_68 << 1 | (uint)((int)local_68 < 0))].root,
                              (ulong)(uint)local_70 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                              0x20 ^ (ulong)(uint)local_70 * -0x75e7c76a1153eaca +
                                     0x1da24fc66dd63e32,0,
                              (HighsHashTableEntry<int,_void> *)&local_60);
          uVar23 = pVar28._8_8_;
        }
        else {
          pVVar16 = HighsHashTree<int,_int>::find_recurse
                              ((NodePtr)(this->invertedHashList).
                                        super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar17].root.
                                        ptrAndType,uVar23,0,(int *)&local_70);
          if (pVVar16 != (ValueType *)0x0) goto LAB_0025ce99;
          local_60.second = local_6c;
          local_60.first = local_70;
          pVar29 = HighsHashTree<int,_int>::insert_recurse
                             (&(this->invertedHashList).
                               super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(int)((int)local_68 << 1 | (uint)((int)local_68 < 0))].root,
                              (ulong)(uint)local_70 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                              0x20 ^ (ulong)(uint)local_70 * -0x75e7c76a1153eaca +
                                     0x1da24fc66dd63e32,0,(HighsHashTableEntry<int,_int> *)&local_60
                             );
          uVar23 = pVar29._8_8_;
        }
        if ((uVar23 & 1) == 0) {
          iVar11._M_current =
               (this->infeasvertexstack).
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (this->infeasvertexstack).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>(local_50,iVar11,&local_68);
          }
          else {
            *iVar11._M_current = local_68;
            ppCVar3 = &(this->infeasvertexstack).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar3 = *ppCVar3 + 1;
          }
        }
        else {
          (this->cliqueentries).
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)local_6c] = local_68;
          piVar4 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (int)((int)local_68 << 1 | (uint)((int)local_68 < 0));
          *piVar4 = *piVar4 + 1;
          local_6c = (CliqueVar)((int)local_6c + 1);
          local_64 = local_6c;
        }
        bVar13 = false;
      }
LAB_0025d029:
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_38);
  }
  CVar26 = local_6c;
  if ((CliqueVar)(local_58 - (int)local_6c) != (CliqueVar)0x0 && (int)local_6c <= local_58) {
    if (local_58 ==
        (int)((ulong)((long)(this->cliqueentries).
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
                (&this->cliqueentries,(long)(int)local_6c);
    }
    else {
      local_60.first = (CliqueVar)(local_58 - (int)local_6c);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_emplace_unique<int,int&>(local_48,(int *)&local_60,(int *)&local_64);
      CVar26 = local_64;
    }
    pCVar14 = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)CVar26 < pCVar14[(int)local_70].end) {
      pCVar5 = pCVar14 + (int)local_70;
      CVar8 = (CliqueVar)pCVar5->start;
      if ((int)CVar26 - (int)CVar8 != 2) {
        if ((int)CVar26 - (int)CVar8 == 1) {
          unlink(this,(char *)(ulong)(uint)CVar8);
          pCVar14 = (this->cliques).
                    super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar14[(int)local_70].start = -1;
          pCVar14[(int)local_70].end = -1;
        }
        else {
          if (CVar26 != CVar8) {
            pCVar5->end = (HighsInt)CVar26;
            goto LAB_0025d1a4;
          }
          pCVar5->start = -1;
          pCVar14[(int)local_70].end = -1;
        }
        __position_00._M_current =
             (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current !=
            (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position_00._M_current = (int)local_70;
          (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          return;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->freeslots,__position_00,
                   (int *)&local_70);
        return;
      }
      unlink(this,(char *)(ulong)(uint)CVar8);
      unlink(this,(char *)(ulong)((this->cliques).
                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)local_70].start + 1
                                 ));
      pCVar14 = (this->cliques).
                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar14[(int)local_70].end = (HighsInt)local_64;
      link(this,(char *)(ulong)(uint)pCVar14[(int)local_70].start,(char *)(long)(int)local_70);
      link(this,(char *)(ulong)((this->cliques).
                                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)local_70].start + 1),
           (char *)(long)(int)local_70);
    }
  }
LAB_0025d1a4:
  pCVar14 = (this->cliques).
            super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar24 = pCVar14[(int)local_70].start;
  iVar19 = pCVar14[(int)local_70].end - iVar24;
  this->numEntries = this->numEntries + iVar19;
  if (iVar19 == 2) {
    pCVar12 = (this->cliqueentries).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start;
    CVar26 = pCVar12[iVar24];
    CVar8 = pCVar12[(long)iVar24 + 1];
    pVar20.second = CVar26;
    pVar20.first = CVar8;
    local_60 = (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>)
               ((long)pVar20 << 0x20 | (ulong)(uint)CVar26);
    if (((uint)CVar8 & 0x7fffffff) < ((uint)CVar26 & 0x7fffffff)) {
      local_60 = pVar20;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
    insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
              ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
                *)&this->sizeTwoCliques,&local_60,(int *)&local_70);
  }
  return;
}

Assistant:

void HighsCliqueTable::doAddClique(const CliqueVar* cliquevars,
                                   HighsInt numcliquevars, bool equality,
                                   HighsInt origin) {
  HighsInt cliqueid;

  if (freeslots.empty()) {
    cliqueid = cliques.size();
    cliques.emplace_back();
  } else {
    cliqueid = freeslots.back();
    freeslots.pop_back();
  }

  cliques[cliqueid].equality = equality;
  cliques[cliqueid].origin = origin;

  std::set<std::pair<HighsInt, int>>::iterator it;
  HighsInt maxEnd;
  if (freespaces.empty() || (it = freespaces.lower_bound(std::make_pair(
                                 numcliquevars, -1))) == freespaces.end()) {
    cliques[cliqueid].start = cliqueentries.size();
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].end;
    cliqueentries.resize(cliques[cliqueid].end);
  } else {
    std::pair<HighsInt, int> freespace = *it;
    freespaces.erase(it);

    cliques[cliqueid].start = freespace.second;
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].start + freespace.first;
  }

  cliques[cliqueid].numZeroFixed = 0;

  bool fixtozero = false;
  HighsInt k = cliques[cliqueid].start;
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    CliqueVar v = cliquevars[i];

    resolveSubstitution(v);

    if (fixtozero) {
      infeasvertexstack.push_back(v);
      continue;
    }

    // due to substitutions the variable may occur together with its complement
    // in this clique and we can fix all other variables in the clique to zero:
    //          x + ~x + ... <= 1
    //   <=> x + 1 - x + ... <= 1
    //   <=>             ... <= 0
    bool clqHasVCompl =
        numcliquevars == 2
            ? invertedHashListSizeTwo[v.complement().index()].contains(cliqueid)
            : invertedHashList[v.complement().index()].contains(cliqueid);

    if (clqHasVCompl) {
      fixtozero = true;
      for (HighsInt j = cliques[cliqueid].start; j != k; ++j) {
        if (cliqueentries[j].col != v.col)
          infeasvertexstack.push_back(cliqueentries[j]);
        unlink(j, cliqueid);
      }
      k = cliques[cliqueid].start;
      continue;
    }

    // due to substitutions the variable may occur twice in this clique and
    // we can fix it to zero:  x + x + ... <= 1  <=>  2x <= 1 <=> x <= 0.5 <=>
    // x = 0
    bool inserted;
    if (numcliquevars == 2)
      inserted = invertedHashListSizeTwo[v.index()].insert(cliqueid);
    else
      inserted = invertedHashList[v.index()].insert(cliqueid, k);

    if (!inserted) {
      infeasvertexstack.push_back(v);
      continue;
    }

    cliqueentries[k] = v;
    ++numcliquesvar[v.index()];
    ++k;
  }

  if (maxEnd > k) {
    if (int(cliqueentries.size()) == maxEnd)
      cliqueentries.resize(k);
    else
      freespaces.emplace(maxEnd - k, k);

    if (cliques[cliqueid].end > k) {
      switch (k - cliques[cliqueid].start) {
        case 0:
          // clique empty, so just mark it as deleted
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 1:
          // size 1 clique is redundant, so unlink the single linked entry
          // and mark it as deleted
          unlink(cliques[cliqueid].start, cliqueid);
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 2:
          // due to substitutions the clique became smaller and is now of size
          // two as a result we need to link it to the size two cliqueset
          // instead of the normal cliqueset
          assert(cliqueid >= 0 && cliqueid < (HighsInt)cliques.size());
          assert(cliques[cliqueid].start >= 0 &&
                 cliques[cliqueid].start < (HighsInt)cliqueentries.size());
          unlink(cliques[cliqueid].start, cliqueid);
          unlink(cliques[cliqueid].start + 1, cliqueid);

          cliques[cliqueid].end = k;

          link(cliques[cliqueid].start, cliqueid);
          link(cliques[cliqueid].start + 1, cliqueid);
          break;
        default:
          cliques[cliqueid].end = k;
      }
    }
  }

  HighsInt cliqueLen = cliques[cliqueid].end - cliques[cliqueid].start;
  numEntries += cliqueLen;
  if (cliqueLen == 2)
    sizeTwoCliques.insert(
        sortedEdge(cliqueentries[cliques[cliqueid].start],
                   cliqueentries[cliques[cliqueid].start + 1]),
        cliqueid);
}